

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hpp
# Opt level: O1

void __thiscall
duckdb::roaring::CompressedArrayContainerScanState<true>::LoadNextValue
          (CompressedArrayContainerScanState<true> *this)

{
  idx_t iVar1;
  uint16_t uVar2;
  int in_ESI;
  
  if ((this->super_ArrayContainerScanState<true>).array_index <
      (this->super_ArrayContainerScanState<true>).count) {
    uVar2 = ContainerSegmentScan::operator++(&this->segment,in_ESI);
    (this->super_ArrayContainerScanState<true>).value = uVar2;
    iVar1 = (this->super_ArrayContainerScanState<true>).array_index;
    (this->super_ArrayContainerScanState<true>).value =
         (this->super_ArrayContainerScanState<true>).data[iVar1] + uVar2;
    (this->super_ArrayContainerScanState<true>).array_index = iVar1 + 1;
  }
  else {
    (this->super_ArrayContainerScanState<true>).finished = true;
  }
  return;
}

Assistant:

void LoadNextValue() override {
		if (this->array_index >= this->count) {
			this->finished = true;
			return;
		}
		this->value = segment++;
		this->value += reinterpret_cast<uint8_t *>(this->data)[this->array_index];
		this->array_index++;
	}